

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Float32_To_Int8(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                    int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  float *src;
  bool bVar1;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    *(char *)destinationBuffer = (char)(int)(*sourceBuffer * 127.0);
    destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride);
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
  }
  return;
}

Assistant:

static void Float32_To_Int8(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    signed char *dest =  (signed char*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        signed char samp = (signed char) (*src * (127.0f));
        *dest = samp;

        src += sourceStride;
        dest += destinationStride;
    }
}